

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintAuto(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint fVerbose;
  uint fNaive;
  char *pcVar5;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fNaive = 0;
  Extra_UtilGetoptReset();
  iVar3 = -1;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Onvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            Abc_NtkAutoPrint(pNtk,iVar3,fNaive,fVerbose);
            return 0;
          }
          pcVar4 = "This command works only for AIGs (run \"strash\").\n";
        }
        iVar3 = -1;
        goto LAB_001f0f58;
      }
      if (iVar2 != 0x6e) break;
      fNaive = fNaive ^ 1;
    }
    if (iVar2 != 0x4f) goto LAB_001f0ed5;
    if (argc <= globalUtilOptind) break;
    iVar3 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
    if (iVar3 < 0) {
LAB_001f0ed5:
      iVar3 = -2;
      Abc_Print(-2,"usage: print_auto [-O <num>] [-nvh]\n");
      Abc_Print(-2,"\t           computes autosymmetries of the PO functions\n");
      Abc_Print(-2,"\t-O <num> : (optional) the 0-based number of the output [default = all]\n");
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fNaive == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-n       : enable naive BDD-based computation [default = %s].\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : enable verbose output [default = %s].\n",pcVar5);
      pcVar4 = "\t-h       : print the command usage\n";
LAB_001f0f58:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
  goto LAB_001f0ed5;
}

Assistant:

int Abc_CommandPrintAuto( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int Output;
    int fNaive;
    int fVerbose;
    extern void Abc_NtkAutoPrint( Abc_Ntk_t * pNtk, int Output, int fNaive, int fVerbose );

    // set defaults
    Output   = -1;
    fNaive   = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Onvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            Output = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Output < 0 )
                goto usage;
            break;
        case 'n':
            fNaive ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }


    Abc_NtkAutoPrint( pNtk, Output, fNaive, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: print_auto [-O <num>] [-nvh]\n" );
    Abc_Print( -2, "\t           computes autosymmetries of the PO functions\n" );
    Abc_Print( -2, "\t-O <num> : (optional) the 0-based number of the output [default = all]\n");
    Abc_Print( -2, "\t-n       : enable naive BDD-based computation [default = %s].\n", fNaive? "yes": "no" );
    Abc_Print( -2, "\t-v       : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}